

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O0

QDebug operator<<(QDebug *debug,QStyleOption *option)

{
  Stream *in_RDI;
  QDebug *in_stack_ffffffffffffffd8;
  
  QDebug::QDebug((QDebug *)in_RDI,in_stack_ffffffffffffffd8);
  return (QDebug)in_RDI;
}

Assistant:

QDebug operator<<(QDebug debug, const QStyleOption &option)
{
#if !defined(QT_NO_DEBUG)
    debug << "QStyleOption(";
    debug << QStyleOption::OptionType(option.type);
    debug << ',' << (option.direction == Qt::RightToLeft ? "RightToLeft" : "LeftToRight");
    debug << ',' << option.state;
    debug << ',' << option.rect;
    debug << ',' << option.styleObject;
    debug << ')';
#else
    Q_UNUSED(option);
#endif
    return debug;
}